

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
     format_custom_arg<fmt::v10::detail::styled_arg<char[7]>,fmt::v10::formatter<fmt::v10::detail::styled_arg<char[7]>,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v10::appender,_char> *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  iterator iVar5;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_48 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_58 = 0xffffffff00000000;
  uStack_50 = 0x100000020000000;
  uStack_40 = 0;
  local_28 = 0;
  pcVar3 = formatter<fmt::v10::basic_string_view<char>,char,void>::
           parse<fmt::v10::basic_format_parse_context<char>>
                     ((formatter<fmt::v10::basic_string_view<char>,char,void> *)&local_58,parse_ctx)
  ;
  pcVar2 = (parse_ctx->format_str_).data_;
  lVar4 = (long)pcVar3 - (long)pcVar2;
  if (-1 < lVar4) {
    (parse_ctx->format_str_).data_ = pcVar2 + lVar4;
    psVar1 = &(parse_ctx->format_str_).size_;
    *psVar1 = *psVar1 - lVar4;
    iVar5 = formatter<fmt::v10::detail::styled_arg<char[7]>,char,void>::
            format<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                      ((formatter<fmt::v10::detail::styled_arg<char[7]>,char,void> *)&local_58,
                       (styled_arg<char[7]> *)arg,ctx);
    (ctx->out_).super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
         (buffer<char> *)iVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
    ;
    return;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/evaikene[P]filefind/fmt/core.h"
              ,0x178,"negative value");
}

Assistant:

static void format_custom_arg(void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    auto f = Formatter();
    parse_ctx.advance_to(f.parse(parse_ctx));
    using qualified_type =
        conditional_t<has_const_formatter<T, Context>(), const T, T>;
    ctx.advance_to(f.format(*static_cast<qualified_type*>(arg), ctx));
  }